

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall XPMP2::UDPMulticast::SendToAll(UDPMulticast *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  UDPMulticast *in_RDI;
  bool in_stack_00000047;
  string local_28 [28];
  uint32_t in_stack_fffffffffffffff4;
  UDPMulticast *pUVar4;
  
  pUVar4 = in_RDI;
  _NetwGetLocalAddresses(in_stack_00000047);
  bVar1 = std::
          set<XPMP2::LocalIntfAddrTy,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
          ::empty((set<XPMP2::LocalIntfAddrTy,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
                   *)0x353ee6);
  in_RDI->bSendToAll = (bool)((bVar1 ^ 0xffU) & 1);
  if ((((bVar1 ^ 0xffU) & 1) != 0) && (in_RDI->oneIntfIdx = 0, glob < 2)) {
    uVar2 = std::__cxx11::string::c_str();
    GetFamily(in_RDI);
    NetwGetInterfaceNames_abi_cxx11_
              ((uint8_t)((ulong)pUVar4 >> 0x38),(uint32_t)pUVar4,in_stack_fffffffffffffff4);
    uVar3 = std::__cxx11::string::c_str();
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Network.cpp"
           ,0x3ec,"SendToAll",logINFO,"MC %s: Sending on ALL interfaces: %s",uVar2,uVar3);
    std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

void UDPMulticast::SendToAll ()
{
    _NetwGetLocalAddresses ();              // makes sure lists of multicast interfaces are filled, too
    if ((bSendToAll = !gAddrLocal.empty())) {
        oneIntfIdx = 0;
        LOG_MSG(logINFO, "MC %s: Sending on ALL interfaces: %s",
                multicastAddr.c_str(), NetwGetInterfaceNames(GetFamily(), IFF_MULTICAST).c_str());
    }
}